

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::emit_custom_templates(CompilerMSL *this)

{
  undefined1 uVar1;
  ExecutionModel EVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  ulong uVar5;
  char **ppcVar6;
  _Base_ptr p_Var7;
  allocator local_81;
  _Base_ptr local_80;
  _Base_ptr local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var3 = (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
  ;
  p_Var7 = &(this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_80 = p_Var7;
LAB_001f0512:
  if (p_Var3 == p_Var7) {
    return;
  }
  uVar1 = (undefined1)p_Var3[1]._M_color;
  if (uVar1 == 0x13) {
    local_78 = p_Var3;
    CompilerGLSL::statement<char_const(&)[46]>
              (&this->super_CompilerGLSL,
               (char (*) [46])"template<typename T, int Cols, int Rows=Cols>");
    CompilerGLSL::statement<char_const(&)[24]>
              (&this->super_CompilerGLSL,(char (*) [24])"struct spvStorageMatrix");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[28]>
              (&this->super_CompilerGLSL,(char (*) [28])"vec<T, Rows> columns[Cols];");
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
    uVar4 = 0;
    do {
      switch(uVar4) {
      case 4:
        CompilerGLSL::statement<char_const(&)[28]>
                  (&this->super_CompilerGLSL,(char (*) [28])"#ifdef __HAVE_IMAGEBLOCKS__");
        break;
      case 5:
        CompilerGLSL::statement<char_const(&)[27]>
                  (&this->super_CompilerGLSL,(char (*) [27])"#ifdef __HAVE_RAYTRACING__");
        break;
      case 6:
        CompilerGLSL::statement<char_const(&)[21]>
                  (&this->super_CompilerGLSL,(char (*) [21])"#ifdef __HAVE_MESH__");
        break;
      case 7:
        goto switchD_001f07ce_caseD_7;
      }
      ::std::__cxx11::string::string
                ((string *)&local_50,emit_custom_templates::address_spaces[uVar4],
                 (allocator *)&local_70);
      CompilerGLSL::statement<char_const(&)[20],std::__cxx11::string_const&,char_const(&)[12]>
                (&this->super_CompilerGLSL,(char (*) [20])"spvStorageMatrix() ",&local_50,
                 (char (*) [12])0x33da65);
      if (uVar4 != 1) {
        CompilerGLSL::
        statement<std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&>
                  (&this->super_CompilerGLSL,&local_50,
                   (char (*) [67])
                   " spvStorageMatrix& operator=(initializer_list<vec<T, Rows>> cols) ",&local_50);
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        CompilerGLSL::statement<char_const(&)[10]>
                  (&this->super_CompilerGLSL,(char (*) [10])"size_t i;");
        CompilerGLSL::statement<char_const(&)[26]>
                  (&this->super_CompilerGLSL,(char (*) [26])"thread vec<T, Rows>* col;");
        CompilerGLSL::statement<char_const(&)[54]>
                  (&this->super_CompilerGLSL,
                   (char (*) [54])"for (i = 0, col = cols.begin(); i < Cols; ++i, ++col)");
        CompilerGLSL::statement<char_const(&)[23]>
                  (&this->super_CompilerGLSL,(char (*) [23])"    columns[i] = *col;");
        CompilerGLSL::statement<char_const(&)[14]>
                  (&this->super_CompilerGLSL,(char (*) [14])"return *this;");
        CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      }
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
      ppcVar6 = emit_custom_templates::address_spaces;
      for (uVar5 = 0; uVar5 != 7; uVar5 = uVar5 + 1) {
        if (uVar4 != uVar5) {
          if (uVar5 == 6) {
            CompilerGLSL::statement<char_const(&)[21]>
                      (&this->super_CompilerGLSL,(char (*) [21])"#ifdef __HAVE_MESH__");
          }
          else if (uVar5 == 5) {
            CompilerGLSL::statement<char_const(&)[27]>
                      (&this->super_CompilerGLSL,(char (*) [27])"#ifdef __HAVE_RAYTRACING__");
          }
          else if (uVar5 == 4) {
            CompilerGLSL::statement<char_const(&)[28]>
                      (&this->super_CompilerGLSL,(char (*) [28])"#ifdef __HAVE_IMAGEBLOCKS__");
          }
        }
        ::std::__cxx11::string::string((string *)&local_70,*ppcVar6,&local_81);
        CompilerGLSL::
        statement<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[28],std::__cxx11::string_const&>
                  (&this->super_CompilerGLSL,(char (*) [24])"spvStorageMatrix(const ",&local_70,
                   (char (*) [28])" matrix<T, Cols, Rows>& m) ",&local_50);
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        CompilerGLSL::statement<char_const(&)[34]>
                  (&this->super_CompilerGLSL,(char (*) [34])"for (size_t i = 0; i < Cols; ++i)");
        CompilerGLSL::statement<char_const(&)[31]>
                  (&this->super_CompilerGLSL,(char (*) [31])"    columns[i] = m.columns[i];");
        CompilerGLSL::end_scope(&this->super_CompilerGLSL);
        CompilerGLSL::
        statement<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[23],std::__cxx11::string_const&,char_const(&)[12]>
                  (&this->super_CompilerGLSL,(char (*) [24])"spvStorageMatrix(const ",&local_70,
                   (char (*) [23])" spvStorageMatrix& m) ",&local_50,(char (*) [12])0x33da65);
        if (uVar4 != 1) {
          CompilerGLSL::
          statement<std::__cxx11::string_const&,char_const(&)[36],std::__cxx11::string_const&,char_const(&)[28],std::__cxx11::string_const&>
                    (&this->super_CompilerGLSL,&local_50,
                     (char (*) [36])" spvStorageMatrix& operator=(const ",&local_70,
                     (char (*) [28])" matrix<T, Cols, Rows>& m) ",&local_50);
          CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
          CompilerGLSL::statement<char_const(&)[34]>
                    (&this->super_CompilerGLSL,(char (*) [34])"for (size_t i = 0; i < Cols; ++i)");
          CompilerGLSL::statement<char_const(&)[31]>
                    (&this->super_CompilerGLSL,(char (*) [31])"    columns[i] = m.columns[i];");
          CompilerGLSL::statement<char_const(&)[14]>
                    (&this->super_CompilerGLSL,(char (*) [14])"return *this;");
          CompilerGLSL::end_scope(&this->super_CompilerGLSL);
          CompilerGLSL::
          statement<std::__cxx11::string_const&,char_const(&)[36],std::__cxx11::string_const&,char_const(&)[23],std::__cxx11::string_const&,char_const(&)[12]>
                    (&this->super_CompilerGLSL,&local_50,
                     (char (*) [36])" spvStorageMatrix& operator=(const ",&local_70,
                     (char (*) [23])" spvStorageMatrix& m) ",&local_50,(char (*) [12])0x33da65);
        }
        if (3 < uVar5 && uVar4 != uVar5) {
          CompilerGLSL::statement<char_const(&)[7]>
                    (&this->super_CompilerGLSL,(char (*) [7])0x2fbd0b);
        }
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
        ::std::__cxx11::string::~string((string *)&local_70);
        ppcVar6 = ppcVar6 + 1;
      }
      CompilerGLSL::statement<char_const(&)[40],std::__cxx11::string_const&>
                (&this->super_CompilerGLSL,(char (*) [40])"operator matrix<T, Cols, Rows>() const ",
                 &local_50);
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[25]>
                (&this->super_CompilerGLSL,(char (*) [25])"matrix<T, Cols, Rows> m;");
      CompilerGLSL::statement<char_const(&)[31]>
                (&this->super_CompilerGLSL,(char (*) [31])"for (int i = 0; i < Cols; ++i)");
      CompilerGLSL::statement<char_const(&)[31]>
                (&this->super_CompilerGLSL,(char (*) [31])"    m.columns[i] = columns[i];");
      CompilerGLSL::statement<char_const(&)[10]>
                (&this->super_CompilerGLSL,(char (*) [10])"return m;");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
      CompilerGLSL::statement<char_const(&)[43],std::__cxx11::string_const&>
                (&this->super_CompilerGLSL,
                 (char (*) [43])"vec<T, Rows> operator[](size_t idx) const ",&local_50);
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[21]>
                (&this->super_CompilerGLSL,(char (*) [21])"return columns[idx];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      if (uVar4 != 1) {
        CompilerGLSL::
        statement<std::__cxx11::string_const&,char_const(&)[39],std::__cxx11::string_const&>
                  (&this->super_CompilerGLSL,&local_50,
                   (char (*) [39])" vec<T, Rows>& operator[](size_t idx) ",&local_50);
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        CompilerGLSL::statement<char_const(&)[21]>
                  (&this->super_CompilerGLSL,(char (*) [21])"return columns[idx];");
        CompilerGLSL::end_scope(&this->super_CompilerGLSL);
        if (3 < uVar4) {
          CompilerGLSL::statement<char_const(&)[7]>
                    (&this->super_CompilerGLSL,(char (*) [7])0x2fbd0b);
        }
      }
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
      ::std::__cxx11::string::~string((string *)&local_50);
      uVar4 = uVar4 + 1;
    } while( true );
  }
  if (uVar1 == 0x12) {
    CompilerGLSL::statement<char_const(&)[33]>
              (&this->super_CompilerGLSL,(char (*) [33])"template<typename T, size_t Num>");
    CompilerGLSL::statement<char_const(&)[22]>
              (&this->super_CompilerGLSL,(char (*) [22])"struct spvUnsafeArray");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[27]>
              (&this->super_CompilerGLSL,(char (*) [27])"T elements[Num ? Num : 1];");
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
    CompilerGLSL::statement<char_const(&)[42]>
              (&this->super_CompilerGLSL,(char (*) [42])"thread T& operator [] (size_t pos) thread")
    ;
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[22]>
              (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[64]>
              (&this->super_CompilerGLSL,
               (char (*) [64])"constexpr const thread T& operator [] (size_t pos) const thread");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[22]>
              (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
    CompilerGLSL::statement<char_const(&)[42]>
              (&this->super_CompilerGLSL,(char (*) [42])"device T& operator [] (size_t pos) device")
    ;
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[22]>
              (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[64]>
              (&this->super_CompilerGLSL,
               (char (*) [64])"constexpr const device T& operator [] (size_t pos) const device");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[22]>
              (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
    CompilerGLSL::statement<char_const(&)[68]>
              (&this->super_CompilerGLSL,
               (char (*) [68])"constexpr const constant T& operator [] (size_t pos) const constant")
    ;
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[22]>
              (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
    CompilerGLSL::statement<char_const(&)[52]>
              (&this->super_CompilerGLSL,
               (char (*) [52])"threadgroup T& operator [] (size_t pos) threadgroup");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[22]>
              (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[74]>
              (&this->super_CompilerGLSL,
               (char (*) [74])
               "constexpr const threadgroup T& operator [] (size_t pos) const threadgroup");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[22]>
              (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    EVar2 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar2 == ExecutionModelMeshEXT) ||
       (EVar2 = Compiler::get_execution_model((Compiler *)this), EVar2 == ExecutionModelTaskEXT)) {
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
      CompilerGLSL::statement<char_const(&)[52]>
                (&this->super_CompilerGLSL,
                 (char (*) [52])"object_data T& operator [] (size_t pos) object_data");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[74]>
                (&this->super_CompilerGLSL,
                 (char (*) [74])
                 "constexpr const object_data T& operator [] (size_t pos) const object_data");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    }
    CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
    goto LAB_001f0cde;
  }
  goto LAB_001f0ce6;
switchD_001f07ce_caseD_7:
  CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
  CompilerGLSL::statement<char_const(&)[41]>
            (&this->super_CompilerGLSL,(char (*) [41])"template<typename T, int Cols, int Rows>");
  CompilerGLSL::statement<char_const(&)[67]>
            (&this->super_CompilerGLSL,
             (char (*) [67])"matrix<T, Rows, Cols> transpose(spvStorageMatrix<T, Cols, Rows> m)");
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[44]>
            (&this->super_CompilerGLSL,(char (*) [44])"return transpose(matrix<T, Cols, Rows>(m));")
  ;
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
  CompilerGLSL::statement<char_const(&)[57]>
            (&this->super_CompilerGLSL,
             (char (*) [57])"typedef spvStorageMatrix<half, 2, 2> spvStorage_half2x2;");
  CompilerGLSL::statement<char_const(&)[57]>
            (&this->super_CompilerGLSL,
             (char (*) [57])"typedef spvStorageMatrix<half, 2, 3> spvStorage_half2x3;");
  CompilerGLSL::statement<char_const(&)[57]>
            (&this->super_CompilerGLSL,
             (char (*) [57])"typedef spvStorageMatrix<half, 2, 4> spvStorage_half2x4;");
  CompilerGLSL::statement<char_const(&)[57]>
            (&this->super_CompilerGLSL,
             (char (*) [57])"typedef spvStorageMatrix<half, 3, 2> spvStorage_half3x2;");
  CompilerGLSL::statement<char_const(&)[57]>
            (&this->super_CompilerGLSL,
             (char (*) [57])"typedef spvStorageMatrix<half, 3, 3> spvStorage_half3x3;");
  CompilerGLSL::statement<char_const(&)[57]>
            (&this->super_CompilerGLSL,
             (char (*) [57])"typedef spvStorageMatrix<half, 3, 4> spvStorage_half3x4;");
  CompilerGLSL::statement<char_const(&)[57]>
            (&this->super_CompilerGLSL,
             (char (*) [57])"typedef spvStorageMatrix<half, 4, 2> spvStorage_half4x2;");
  CompilerGLSL::statement<char_const(&)[57]>
            (&this->super_CompilerGLSL,
             (char (*) [57])"typedef spvStorageMatrix<half, 4, 3> spvStorage_half4x3;");
  CompilerGLSL::statement<char_const(&)[57]>
            (&this->super_CompilerGLSL,
             (char (*) [57])"typedef spvStorageMatrix<half, 4, 4> spvStorage_half4x4;");
  CompilerGLSL::statement<char_const(&)[59]>
            (&this->super_CompilerGLSL,
             (char (*) [59])"typedef spvStorageMatrix<float, 2, 2> spvStorage_float2x2;");
  CompilerGLSL::statement<char_const(&)[59]>
            (&this->super_CompilerGLSL,
             (char (*) [59])"typedef spvStorageMatrix<float, 2, 3> spvStorage_float2x3;");
  CompilerGLSL::statement<char_const(&)[59]>
            (&this->super_CompilerGLSL,
             (char (*) [59])"typedef spvStorageMatrix<float, 2, 4> spvStorage_float2x4;");
  CompilerGLSL::statement<char_const(&)[59]>
            (&this->super_CompilerGLSL,
             (char (*) [59])"typedef spvStorageMatrix<float, 3, 2> spvStorage_float3x2;");
  CompilerGLSL::statement<char_const(&)[59]>
            (&this->super_CompilerGLSL,
             (char (*) [59])"typedef spvStorageMatrix<float, 3, 3> spvStorage_float3x3;");
  CompilerGLSL::statement<char_const(&)[59]>
            (&this->super_CompilerGLSL,
             (char (*) [59])"typedef spvStorageMatrix<float, 3, 4> spvStorage_float3x4;");
  CompilerGLSL::statement<char_const(&)[59]>
            (&this->super_CompilerGLSL,
             (char (*) [59])"typedef spvStorageMatrix<float, 4, 2> spvStorage_float4x2;");
  CompilerGLSL::statement<char_const(&)[59]>
            (&this->super_CompilerGLSL,
             (char (*) [59])"typedef spvStorageMatrix<float, 4, 3> spvStorage_float4x3;");
  CompilerGLSL::statement<char_const(&)[59]>
            (&this->super_CompilerGLSL,
             (char (*) [59])"typedef spvStorageMatrix<float, 4, 4> spvStorage_float4x4;");
  p_Var3 = local_78;
LAB_001f0cde:
  p_Var7 = local_80;
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
LAB_001f0ce6:
  p_Var3 = (_Base_ptr)::std::_Rb_tree_increment(p_Var3);
  goto LAB_001f0512;
}

Assistant:

void CompilerMSL::emit_custom_templates()
{
	static const char * const address_spaces[] = {
		"thread", "constant", "device", "threadgroup", "threadgroup_imageblock", "ray_data", "object_data"
	};

	for (const auto &spv_func : spv_function_implementations)
	{
		switch (spv_func)
		{
		case SPVFuncImplUnsafeArray:
			statement("template<typename T, size_t Num>");
			statement("struct spvUnsafeArray");
			begin_scope();
			statement("T elements[Num ? Num : 1];");
			statement("");
			statement("thread T& operator [] (size_t pos) thread");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("constexpr const thread T& operator [] (size_t pos) const thread");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("");
			statement("device T& operator [] (size_t pos) device");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("constexpr const device T& operator [] (size_t pos) const device");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("");
			statement("constexpr const constant T& operator [] (size_t pos) const constant");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("");
			statement("threadgroup T& operator [] (size_t pos) threadgroup");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("constexpr const threadgroup T& operator [] (size_t pos) const threadgroup");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			if (get_execution_model() == spv::ExecutionModelMeshEXT ||
			    get_execution_model() == spv::ExecutionModelTaskEXT)
			{
				statement("");
				statement("object_data T& operator [] (size_t pos) object_data");
				begin_scope();
				statement("return elements[pos];");
				end_scope();
				statement("constexpr const object_data T& operator [] (size_t pos) const object_data");
				begin_scope();
				statement("return elements[pos];");
				end_scope();
			}
			end_scope_decl();
			statement("");
			break;

		case SPVFuncImplStorageMatrix:
			statement("template<typename T, int Cols, int Rows=Cols>");
			statement("struct spvStorageMatrix");
			begin_scope();
			statement("vec<T, Rows> columns[Cols];");
			statement("");
			for (size_t method_idx = 0; method_idx < sizeof(address_spaces) / sizeof(address_spaces[0]); ++method_idx)
			{
				// Some address spaces require particular features.
				if (method_idx == 4) // threadgroup_imageblock
					statement("#ifdef __HAVE_IMAGEBLOCKS__");
				else if (method_idx == 5) // ray_data
					statement("#ifdef __HAVE_RAYTRACING__");
				else if (method_idx == 6) // object_data
					statement("#ifdef __HAVE_MESH__");
				const string &method_as = address_spaces[method_idx];
				statement("spvStorageMatrix() ", method_as, " = default;");
				if (method_idx != 1) // constant
				{
					statement(method_as, " spvStorageMatrix& operator=(initializer_list<vec<T, Rows>> cols) ",
					          method_as);
					begin_scope();
					statement("size_t i;");
					statement("thread vec<T, Rows>* col;");
					statement("for (i = 0, col = cols.begin(); i < Cols; ++i, ++col)");
					statement("    columns[i] = *col;");
					statement("return *this;");
					end_scope();
				}
				statement("");
				for (size_t param_idx = 0; param_idx < sizeof(address_spaces) / sizeof(address_spaces[0]); ++param_idx)
				{
					if (param_idx != method_idx)
					{
						if (param_idx == 4) // threadgroup_imageblock
							statement("#ifdef __HAVE_IMAGEBLOCKS__");
						else if (param_idx == 5) // ray_data
							statement("#ifdef __HAVE_RAYTRACING__");
						else if (param_idx == 6) // object_data
							statement("#ifdef __HAVE_MESH__");
					}
					const string &param_as = address_spaces[param_idx];
					statement("spvStorageMatrix(const ", param_as, " matrix<T, Cols, Rows>& m) ", method_as);
					begin_scope();
					statement("for (size_t i = 0; i < Cols; ++i)");
					statement("    columns[i] = m.columns[i];");
					end_scope();
					statement("spvStorageMatrix(const ", param_as, " spvStorageMatrix& m) ", method_as, " = default;");
					if (method_idx != 1) // constant
					{
						statement(method_as, " spvStorageMatrix& operator=(const ", param_as,
						          " matrix<T, Cols, Rows>& m) ", method_as);
						begin_scope();
						statement("for (size_t i = 0; i < Cols; ++i)");
						statement("    columns[i] = m.columns[i];");
						statement("return *this;");
						end_scope();
						statement(method_as, " spvStorageMatrix& operator=(const ", param_as, " spvStorageMatrix& m) ",
						          method_as, " = default;");
					}
					if (param_idx != method_idx && param_idx >= 4)
						statement("#endif");
					statement("");
				}
				statement("operator matrix<T, Cols, Rows>() const ", method_as);
				begin_scope();
				statement("matrix<T, Cols, Rows> m;");
				statement("for (int i = 0; i < Cols; ++i)");
				statement("    m.columns[i] = columns[i];");
				statement("return m;");
				end_scope();
				statement("");
				statement("vec<T, Rows> operator[](size_t idx) const ", method_as);
				begin_scope();
				statement("return columns[idx];");
				end_scope();
				if (method_idx != 1) // constant
				{
					statement(method_as, " vec<T, Rows>& operator[](size_t idx) ", method_as);
					begin_scope();
					statement("return columns[idx];");
					end_scope();
				}
				if (method_idx >= 4)
					statement("#endif");
				statement("");
			}
			end_scope_decl();
			statement("");
			statement("template<typename T, int Cols, int Rows>");
			statement("matrix<T, Rows, Cols> transpose(spvStorageMatrix<T, Cols, Rows> m)");
			begin_scope();
			statement("return transpose(matrix<T, Cols, Rows>(m));");
			end_scope();
			statement("");
			statement("typedef spvStorageMatrix<half, 2, 2> spvStorage_half2x2;");
			statement("typedef spvStorageMatrix<half, 2, 3> spvStorage_half2x3;");
			statement("typedef spvStorageMatrix<half, 2, 4> spvStorage_half2x4;");
			statement("typedef spvStorageMatrix<half, 3, 2> spvStorage_half3x2;");
			statement("typedef spvStorageMatrix<half, 3, 3> spvStorage_half3x3;");
			statement("typedef spvStorageMatrix<half, 3, 4> spvStorage_half3x4;");
			statement("typedef spvStorageMatrix<half, 4, 2> spvStorage_half4x2;");
			statement("typedef spvStorageMatrix<half, 4, 3> spvStorage_half4x3;");
			statement("typedef spvStorageMatrix<half, 4, 4> spvStorage_half4x4;");
			statement("typedef spvStorageMatrix<float, 2, 2> spvStorage_float2x2;");
			statement("typedef spvStorageMatrix<float, 2, 3> spvStorage_float2x3;");
			statement("typedef spvStorageMatrix<float, 2, 4> spvStorage_float2x4;");
			statement("typedef spvStorageMatrix<float, 3, 2> spvStorage_float3x2;");
			statement("typedef spvStorageMatrix<float, 3, 3> spvStorage_float3x3;");
			statement("typedef spvStorageMatrix<float, 3, 4> spvStorage_float3x4;");
			statement("typedef spvStorageMatrix<float, 4, 2> spvStorage_float4x2;");
			statement("typedef spvStorageMatrix<float, 4, 3> spvStorage_float4x3;");
			statement("typedef spvStorageMatrix<float, 4, 4> spvStorage_float4x4;");
			statement("");
			break;

		default:
			break;
		}
	}
}